

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

void __thiscall LiteralTokenizerRule::~LiteralTokenizerRule(LiteralTokenizerRule *this)

{
  (this->super_TokenizerRule)._vptr_TokenizerRule = (_func_int **)&PTR_tryMatch_00139440;
  std::__cxx11::string::~string((string *)&this->literal);
  return;
}

Assistant:

virtual ~LiteralTokenizerRule() = default;